

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveFullBranchingProblemAndUpdateLabels
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this)

{
  bool bVar1;
  PartitionGraph *in_RDI;
  pointer pEVar2;
  reference rVar3;
  uchar *label;
  iterator __end0;
  iterator __begin0;
  Solution *__range2;
  BranchingOptimizer branchingOptimizer;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_ffffffffffffff28;
  _Bit_type *in_stack_ffffffffffffff30;
  HungarianBranching<lineage::heuristics::PartitionGraph> *pHVar4;
  vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  *__n;
  uint *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_ffffffffffffffe0;
  
  pHVar4 = (HungarianBranching<lineage::heuristics::PartitionGraph> *)&stack0xffffffffffffffb8;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (pHVar4,in_RDI);
  pEVar2 = (pointer)branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                              (in_stack_ffffffffffffffe0);
  in_RDI[1].super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
  __n = &(in_RDI->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_;
  this_00 = &(in_RDI->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  std::vector<bool,_std::allocator<bool>_>::clear((vector<bool,_std::allocator<bool>_> *)pHVar4);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1bee8b);
  std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)this_00,(size_type)__n);
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::getSolution
            (in_stack_ffffffffffffff28);
  local_60 = local_78;
  local_80._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_ffffffffffffff28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
  rVar3._M_mask = (_Bit_type)in_stack_ffffffffffffff28;
  rVar3._M_p = in_stack_ffffffffffffff30;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)rVar3._M_p,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)rVar3._M_mask);
    pHVar4 = (HungarianBranching<lineage::heuristics::PartitionGraph> *)rVar3._M_p;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(&local_80);
    rVar3 = std::vector<bool,std::allocator<bool>>::emplace_back<unsigned_char&>
                      ((vector<bool,_std::allocator<bool>_> *)rVar3._M_p,(uchar *)rVar3._M_mask);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_80);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::~HungarianBranching(pHVar4);
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::solveFullBranchingProblemAndUpdateLabels()
{
    auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
    branchingObjective_ = branchingOptimizer.optimize();

    partitionGraph_.branchingLabels_.clear();
    partitionGraph_.branchingLabels_.reserve(partitionGraph_.numberOfEdges());

    for (auto&& label : branchingOptimizer.getSolution()) {
        partitionGraph_.branchingLabels_.emplace_back(label);
    }
}